

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

int llvm::APInt::tcDivide(WordType *lhs,WordType *rhs,WordType *remainder,WordType *srhs,uint parts)

{
  ulong uVar1;
  long lVar2;
  uint i;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  int local_4c;
  
  if (((remainder == srhs) || (lhs == remainder)) || (lhs == srhs)) {
    __assert_fail("lhs != remainder && lhs != srhs && remainder != srhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x9d7,
                  "static int llvm::APInt::tcDivide(WordType *, const WordType *, WordType *, WordType *, unsigned int)"
                 );
  }
  iVar3 = parts * -0x40;
  uVar9 = parts - 1;
LAB_00183171:
  iVar3 = iVar3 + 0x40;
  uVar8 = rhs[uVar9];
  if (uVar8 == 0) goto code_r0x0018317c;
  lVar2 = 0x3f;
  if (uVar8 != 0) {
    for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  iVar3 = (((uint)lVar2 ^ 0x3f) - iVar3 ^ 0x3f) + 1;
  goto LAB_00183196;
code_r0x0018317c:
  bVar11 = uVar9 == 0;
  uVar9 = uVar9 - 1;
  if (bVar11) goto code_r0x00183184;
  goto LAB_00183171;
code_r0x00183184:
  iVar3 = 0;
LAB_00183196:
  if (iVar3 == 0) {
    local_4c = 1;
  }
  else {
    uVar9 = parts * 0x40 - iVar3;
    uVar8 = 1L << ((byte)uVar9 & 0x3f);
    uVar7 = (ulong)parts;
    if (parts == 0) {
      tcShiftLeft(srhs,0,uVar9);
    }
    else {
      uVar5 = 0;
      do {
        srhs[uVar5] = rhs[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      tcShiftLeft(srhs,parts,uVar9);
      if (parts == 0) goto LAB_00183322;
      uVar5 = 0;
      do {
        remainder[uVar5] = lhs[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    if (parts == 0) {
LAB_00183322:
      __assert_fail("parts > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x892,"static void llvm::APInt::tcSet(WordType *, WordType, unsigned int)");
    }
    *lhs = 0;
    if (parts != 1) {
      memset(lhs + 1,0,(ulong)(parts - 1) << 3);
    }
    uVar10 = uVar9 >> 6;
    uVar5 = uVar7;
LAB_00183255:
    do {
      uVar6 = uVar5 - 1;
      if (uVar5 == 0) {
LAB_00183267:
        uVar5 = 0;
        bVar11 = false;
        do {
          uVar6 = remainder[uVar5];
          uVar1 = srhs[uVar5];
          if (bVar11) {
            remainder[uVar5] = ~uVar1 + uVar6;
            bVar11 = uVar6 <= ~uVar1 + uVar6;
          }
          else {
            bVar11 = uVar6 < uVar1;
            remainder[uVar5] = uVar6 - uVar1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
        lhs[uVar10] = lhs[uVar10] | uVar8;
      }
      else {
        uVar5 = uVar6;
        if (remainder[uVar6] == srhs[uVar6]) goto LAB_00183255;
        if (srhs[uVar6] < remainder[uVar6]) goto LAB_00183267;
      }
      local_4c = 0;
      if (uVar9 == 0) {
        uVar4 = 0;
      }
      else {
        uVar10 = uVar10 - (uVar8 < 2);
        bVar11 = uVar8 < 2;
        uVar8 = uVar8 >> 1;
        if (bVar11) {
          uVar8 = 0x8000000000000000;
        }
        uVar4 = uVar9 - 1;
        tcShiftRight(srhs,parts,1);
      }
      bVar11 = uVar9 != 0;
      uVar5 = uVar7;
      uVar9 = uVar4;
    } while (bVar11);
  }
  return local_4c;
}

Assistant:

int APInt::tcDivide(WordType *lhs, const WordType *rhs,
                    WordType *remainder, WordType *srhs,
                    unsigned parts) {
  assert(lhs != remainder && lhs != srhs && remainder != srhs);

  unsigned shiftCount = tcMSB(rhs, parts) + 1;
  if (shiftCount == 0)
    return true;

  shiftCount = parts * APINT_BITS_PER_WORD - shiftCount;
  unsigned n = shiftCount / APINT_BITS_PER_WORD;
  WordType mask = (WordType) 1 << (shiftCount % APINT_BITS_PER_WORD);

  tcAssign(srhs, rhs, parts);
  tcShiftLeft(srhs, parts, shiftCount);
  tcAssign(remainder, lhs, parts);
  tcSet(lhs, 0, parts);

  /* Loop, subtracting SRHS if REMAINDER is greater and adding that to
     the total.  */
  for (;;) {
    int compare = tcCompare(remainder, srhs, parts);
    if (compare >= 0) {
      tcSubtract(remainder, srhs, 0, parts);
      lhs[n] |= mask;
    }

    if (shiftCount == 0)
      break;
    shiftCount--;
    tcShiftRight(srhs, parts, 1);
    if ((mask >>= 1) == 0) {
      mask = (WordType) 1 << (APINT_BITS_PER_WORD - 1);
      n--;
    }
  }

  return false;
}